

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_data.cc
# Opt level: O3

void CRYPTO_free_ex_data(int class_index,void *obj,CRYPTO_EX_DATA *ad)

{
  uint uVar1;
  undefined8 *puVar2;
  void *pvVar3;
  long *plVar4;
  int idx;
  undefined4 in_register_0000003c;
  long lVar6;
  uint uVar7;
  long lVar5;
  
  lVar6 = CONCAT44(in_register_0000003c,class_index);
  if (ad->sk != (stack_st_void *)0x0) {
    uVar1 = *(uint *)(lVar6 + 0x48);
    if ((*(byte *)(lVar6 + 0x4c) ^ 0x7fffffff) < uVar1) {
      __assert_fail("num_funcs <= (size_t)(INT_MAX - ex_data_class->num_reserved)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ex_data.cc"
                    ,0x7b,
                    "void CRYPTO_free_ex_data(CRYPTO_EX_DATA_CLASS *, void *, CRYPTO_EX_DATA *)");
    }
    if (uVar1 != 0) {
      plVar4 = (long *)(lVar6 + 0x38);
      uVar7 = 0;
      do {
        lVar5 = *plVar4;
        if (*(long *)(lVar5 + 0x10) != 0) {
          idx = *(byte *)(lVar6 + 0x4c) + uVar7;
          pvVar3 = CRYPTO_get_ex_data(ad,idx);
          puVar2 = (undefined8 *)*plVar4;
          (*(code *)puVar2[2])(obj,pvVar3,ad,idx,*puVar2,puVar2[1]);
          lVar5 = *plVar4;
        }
        plVar4 = (long *)(lVar5 + 0x18);
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
    OPENSSL_sk_free((OPENSSL_STACK *)ad->sk);
    ad->sk = (stack_st_void *)0x0;
  }
  return;
}

Assistant:

void CRYPTO_free_ex_data(CRYPTO_EX_DATA_CLASS *ex_data_class, void *obj,
                         CRYPTO_EX_DATA *ad) {
  if (ad->sk == NULL) {
    // Nothing to do.
    return;
  }

  uint32_t num_funcs = CRYPTO_atomic_load_u32(&ex_data_class->num_funcs);
  // |CRYPTO_get_ex_new_index_ex| will not allocate indices beyond |INT_MAX|.
  assert(num_funcs <= (size_t)(INT_MAX - ex_data_class->num_reserved));

  // Defer dereferencing |ex_data_class->funcs| and |funcs->next|. It must come
  // after the |num_funcs| comparison to be correctly synchronized.
  CRYPTO_EX_DATA_FUNCS *const *funcs = &ex_data_class->funcs;
  for (uint32_t i = 0; i < num_funcs; i++) {
    if ((*funcs)->free_func != NULL) {
      int index = (int)i + ex_data_class->num_reserved;
      void *ptr = CRYPTO_get_ex_data(ad, index);
      (*funcs)->free_func(obj, ptr, ad, index, (*funcs)->argl, (*funcs)->argp);
    }
    funcs = &(*funcs)->next;
  }

  sk_void_free(ad->sk);
  ad->sk = NULL;
}